

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,double,duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *accessor)

{
  MadAccessor<double,_double,_double> *pMVar1;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
  __comp;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
  __comp_00;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
  __comp_01;
  QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
  *in_RCX;
  QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
  *in_RDI;
  undefined1 auVar2 [16];
  double hi;
  double lo;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
  comp;
  double local_b0;
  RESULT_TYPE local_a8;
  double local_a0 [6];
  unsigned_long *in_stack_ffffffffffffff90;
  QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
  *__last;
  unsigned_long *in_stack_ffffffffffffff98;
  unsigned_long *__nth;
  unsigned_long *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
  *in_stack_ffffffffffffffc0;
  QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
  *pQStack_38;
  unsigned_long *local_30;
  double local_8;
  
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
  ::QuantileCompare((QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
                     *)&stack0xffffffffffffffc0,in_RCX,(bool)(*(byte *)&in_RDI->outer & 1));
  if (in_RDI[1].inner == (QuantileIndirect<double> *)in_RDI[1].outer) {
    __comp.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *)local_30;
    __comp.accessor_l = pQStack_38;
    __comp._16_8_ = in_stack_ffffffffffffffc0;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__comp)
    ;
    QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
    ::operator()(in_RDI,local_30);
    local_8 = CastInterpolation::Cast<double,double>
                        ((double *)pQStack_38,(Vector *)in_stack_ffffffffffffffc0);
  }
  else {
    __comp_00.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *)in_stack_ffffffffffffffb8;
    __comp_00.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *)in_stack_ffffffffffffffb0;
    __comp_00._16_8_ = in_stack_ffffffffffffffc0;
    __last = pQStack_38;
    __nth = local_30;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>
              (in_stack_ffffffffffffffa0,local_30,(unsigned_long *)pQStack_38,__comp_00);
    __comp_01.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *)in_stack_ffffffffffffffb8;
    __comp_01.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *)in_stack_ffffffffffffffb0;
    __comp_01._16_8_ = in_stack_ffffffffffffffc0;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>
              (in_stack_ffffffffffffffa0,__nth,(unsigned_long *)__last,__comp_01);
    local_a8 = QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
               ::operator()(in_RDI,local_30);
    local_a0[0] = CastInterpolation::Cast<double,double>
                            ((double *)pQStack_38,(Vector *)in_stack_ffffffffffffffc0);
    QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
    ::operator()(in_RDI,local_30);
    local_b0 = CastInterpolation::Cast<double,double>
                         ((double *)pQStack_38,(Vector *)in_stack_ffffffffffffffc0);
    pMVar1 = in_RDI[1].outer;
    auVar2._8_4_ = (int)((ulong)pMVar1 >> 0x20);
    auVar2._0_8_ = pMVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = CastInterpolation::Interpolate<double>
                        (local_a0,(double)in_RDI->inner -
                                  ((auVar2._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)pMVar1) - 4503599627370496.0)),
                         &local_b0);
  }
  return local_8;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}